

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O1

qint64 __thiscall QAbstractFileEngine::readLine(QAbstractFileEngine *this,char *data,qint64 maxlen)

{
  int iVar1;
  int extraout_var;
  long lVar2;
  qint64 unaff_R12;
  long lVar3;
  long in_FS_OFFSET;
  bool bVar4;
  char c;
  char local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = 0;
  do {
    lVar3 = lVar2;
    if (maxlen <= lVar2) break;
    local_39 = -0x56;
    iVar1 = (*this->_vptr_QAbstractFileEngine[0x23])(this,&local_39,1);
    if (CONCAT44(extraout_var,iVar1) == 0 || extraout_var < 0) {
      unaff_R12 = -1;
      if (0 < lVar2) {
        unaff_R12 = lVar2;
      }
      bVar4 = false;
    }
    else {
      lVar2 = lVar2 + 1;
      *data = local_39;
      data = data + 1;
      bVar4 = local_39 != '\n';
      if (!bVar4) {
        unaff_R12 = lVar2;
      }
    }
    lVar3 = unaff_R12;
  } while (bVar4);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return lVar3;
}

Assistant:

qint64 QAbstractFileEngine::readLine(char *data, qint64 maxlen)
{
    qint64 readSoFar = 0;
    while (readSoFar < maxlen) {
        char c;
        qint64 readResult = read(&c, 1);
        if (readResult <= 0)
            return (readSoFar > 0) ? readSoFar : -1;
        ++readSoFar;
        *data++ = c;
        if (c == '\n')
            return readSoFar;
    }
    return readSoFar;
}